

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall
flatbuffers::rust::RustGenerator::GenRootTableFuncs(RustGenerator *this,StructDef *struct_def)

{
  IdlNamer *pIVar1;
  CodeWriter *this_00;
  Parser *pPVar2;
  string *psVar3;
  string sStack_c08;
  allocator<char> local_be1;
  string local_be0;
  string local_bc0;
  string local_ba0;
  string local_b80;
  string local_b60;
  string local_b40;
  string local_b20;
  string local_b00;
  string local_ae0;
  string local_ac0;
  string local_aa0;
  string local_a80;
  string local_a60;
  string local_a40;
  string local_a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a00;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if (((this->super_BaseGenerator).parser_)->root_struct_def_ != (StructDef *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&sStack_c08,"STRUCT_TY",&local_be1)
    ;
    pIVar1 = &this->namer_;
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_be0,pIVar1,struct_def);
    this_00 = &this->code_;
    CodeWriter::SetValue(this_00,&sStack_c08,&local_be0);
    std::__cxx11::string::~string((string *)&local_be0);
    std::__cxx11::string::~string((string *)&sStack_c08);
    std::__cxx11::string::string<std::allocator<char>>((string *)&sStack_c08,"STRUCT_FN",&local_be1)
    ;
    (*(pIVar1->super_Namer)._vptr_Namer[6])(&local_be0,pIVar1,struct_def);
    CodeWriter::SetValue(this_00,&sStack_c08,&local_be0);
    std::__cxx11::string::~string((string *)&local_be0);
    std::__cxx11::string::~string((string *)&sStack_c08);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_c08,"STRUCT_CONST",&local_be1);
    (*(this->namer_).super_Namer._vptr_Namer[0x14])
              (&local_be0,pIVar1,struct_def,(ulong)(this->namer_).super_Namer.config_.constants);
    CodeWriter::SetValue(this_00,&sStack_c08,&local_be0);
    std::__cxx11::string::~string((string *)&local_be0);
    std::__cxx11::string::~string((string *)&sStack_c08);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"#[inline]",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"/// Verifies that a buffer of bytes contains a `{{STRUCT_TY}}`",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"/// and returns it.",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"/// Note that verification is still experimental and may not",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"/// catch every error, or be maximally performant. For the",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"/// previous, unchecked, behavior use",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"/// `root_as_{{STRUCT_FN}}_unchecked`.",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,
               "pub fn root_as_{{STRUCT_FN}}(buf: &[u8]) -> Result<{{STRUCT_TY}}, flatbuffers::InvalidFlatbuffer> {"
               ,(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"  flatbuffers::root::<{{STRUCT_TY}}>(buf)",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"}",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,"#[inline]",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"/// Verifies that a buffer of bytes contains a size prefixed",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"/// `{{STRUCT_TY}}` and returns it.",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"/// Note that verification is still experimental and may not",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,"/// catch every error, or be maximally performant. For the",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"/// previous, unchecked, behavior use",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_240,"/// `size_prefixed_root_as_{{STRUCT_FN}}_unchecked`.",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,
               "pub fn size_prefixed_root_as_{{STRUCT_FN}}(buf: &[u8]) -> Result<{{STRUCT_TY}}, flatbuffers::InvalidFlatbuffer> {"
               ,(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"  flatbuffers::size_prefixed_root::<{{STRUCT_TY}}>(buf)",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"}",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"#[inline]",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"/// Verifies, with the given options, that a buffer of bytes",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"/// contains a `{{STRUCT_TY}}` and returns it.",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"/// Note that verification is still experimental and may not",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"/// catch every error, or be maximally performant. For the",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"/// previous, unchecked, behavior use",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"/// `root_as_{{STRUCT_FN}}_unchecked`.",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"pub fn root_as_{{STRUCT_FN}}_with_opts<\'b, \'o>(",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"  opts: &\'o flatbuffers::VerifierOptions,",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"  buf: &\'b [u8],",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,
               ") -> Result<{{STRUCT_TY}}<\'b>, flatbuffers::InvalidFlatbuffer> {",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,"  flatbuffers::root_with_opts::<{{STRUCT_TY}}<\'b>>(opts, buf)"
               ,(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"}",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,"#[inline]",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_460);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,
               "/// Verifies, with the given verifier options, that a buffer of",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a0,"/// bytes contains a size prefixed `{{STRUCT_TY}}` and returns"
               ,(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c0,
               "/// it. Note that verification is still experimental and may not",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e0,"/// catch every error, or be maximally performant. For the",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_4e0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_500,"/// previous, unchecked, behavior use",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_500);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_520,"/// `root_as_{{STRUCT_FN}}_unchecked`.",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_520);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_540,
               "pub fn size_prefixed_root_as_{{STRUCT_FN}}_with_opts<\'b, \'o>(",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_540);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_560,"  opts: &\'o flatbuffers::VerifierOptions,",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_560);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_580,"  buf: &\'b [u8],",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_580);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5a0,
               ") -> Result<{{STRUCT_TY}}<\'b>, flatbuffers::InvalidFlatbuffer> {",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_5a0);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5c0,
               "  flatbuffers::size_prefixed_root_with_opts::<{{STRUCT_TY}}<\'b>>(opts, buf)",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_5c0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5e0,"}",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_5e0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_600,"#[inline]",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_600);
    std::__cxx11::string::~string((string *)&local_600);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_620,
               "/// Assumes, without verification, that a buffer of bytes contains a {{STRUCT_TY}} and returns it."
               ,(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_620);
    std::__cxx11::string::~string((string *)&local_620);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_640,"/// # Safety",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_640);
    std::__cxx11::string::~string((string *)&local_640);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_660,
               "/// Callers must trust the given bytes do indeed contain a valid `{{STRUCT_TY}}`.",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_660);
    std::__cxx11::string::~string((string *)&local_660);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_680,
               "pub unsafe fn root_as_{{STRUCT_FN}}_unchecked(buf: &[u8]) -> {{STRUCT_TY}} {",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_680);
    std::__cxx11::string::~string((string *)&local_680);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a0,"  flatbuffers::root_unchecked::<{{STRUCT_TY}}>(buf)",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_6a0);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6c0,"}",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_6c0);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6e0,"#[inline]",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_6e0);
    std::__cxx11::string::~string((string *)&local_6e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_700,
               "/// Assumes, without verification, that a buffer of bytes contains a size prefixed {{STRUCT_TY}} and returns it."
               ,(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_700);
    std::__cxx11::string::~string((string *)&local_700);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_720,"/// # Safety",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_720);
    std::__cxx11::string::~string((string *)&local_720);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_740,
               "/// Callers must trust the given bytes do indeed contain a valid size prefixed `{{STRUCT_TY}}`."
               ,(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_740);
    std::__cxx11::string::~string((string *)&local_740);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_760,
               "pub unsafe fn size_prefixed_root_as_{{STRUCT_FN}}_unchecked(buf: &[u8]) -> {{STRUCT_TY}} {"
               ,(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_760);
    std::__cxx11::string::~string((string *)&local_760);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_780,
               "  flatbuffers::size_prefixed_root_unchecked::<{{STRUCT_TY}}>(buf)",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_780);
    std::__cxx11::string::~string((string *)&local_780);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7a0,"}",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_7a0);
    std::__cxx11::string::~string((string *)&local_7a0);
    pPVar2 = (this->super_BaseGenerator).parser_;
    if ((pPVar2->file_identifier_)._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7c0,"pub const {{STRUCT_CONST}}_IDENTIFIER: &str\\",
                 (allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_7c0);
      std::__cxx11::string::~string((string *)&local_7c0);
      std::operator+(&sStack_c08," = \"",&((this->super_BaseGenerator).parser_)->file_identifier_);
      std::operator+(&local_7e0,&sStack_c08,"\";");
      CodeWriter::operator+=(this_00,&local_7e0);
      std::__cxx11::string::~string((string *)&local_7e0);
      std::__cxx11::string::~string((string *)&sStack_c08);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_800,"",(allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_800);
      std::__cxx11::string::~string((string *)&local_800);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_820,"#[inline]",(allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_820);
      std::__cxx11::string::~string((string *)&local_820);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_840,"pub fn {{STRUCT_FN}}_buffer_has_identifier\\",
                 (allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_840);
      std::__cxx11::string::~string((string *)&local_840);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_860,"(buf: &[u8]) -> bool {",(allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_860);
      std::__cxx11::string::~string((string *)&local_860);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_880,"  flatbuffers::buffer_has_identifier(buf, \\",
                 (allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_880);
      std::__cxx11::string::~string((string *)&local_880);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8a0,"{{STRUCT_CONST}}_IDENTIFIER, false)",
                 (allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_8a0);
      std::__cxx11::string::~string((string *)&local_8a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8c0,"}",(allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_8c0);
      std::__cxx11::string::~string((string *)&local_8c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8e0,"",(allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_8e0);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_900,"#[inline]",(allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_900);
      std::__cxx11::string::~string((string *)&local_900);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_920,"pub fn {{STRUCT_FN}}_size_prefixed\\",
                 (allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_920);
      std::__cxx11::string::~string((string *)&local_920);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_940,"_buffer_has_identifier(buf: &[u8]) -> bool {",
                 (allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_940);
      std::__cxx11::string::~string((string *)&local_940);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_960,"  flatbuffers::buffer_has_identifier(buf, \\",
                 (allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_960);
      std::__cxx11::string::~string((string *)&local_960);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_980,"{{STRUCT_CONST}}_IDENTIFIER, true)",
                 (allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_980);
      std::__cxx11::string::~string((string *)&local_980);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9a0,"}",(allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_9a0);
      std::__cxx11::string::~string((string *)&local_9a0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9c0,"",(allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_9c0);
      std::__cxx11::string::~string((string *)&local_9c0);
      pPVar2 = (this->super_BaseGenerator).parser_;
    }
    if ((pPVar2->file_extension_)._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9e0,"pub const {{STRUCT_CONST}}_EXTENSION: &str = \\",
                 (allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_9e0);
      std::__cxx11::string::~string((string *)&local_9e0);
      std::operator+(&sStack_c08,"\"",&((this->super_BaseGenerator).parser_)->file_extension_);
      std::operator+(&local_a00,&sStack_c08,"\";");
      CodeWriter::operator+=(this_00,&local_a00);
      std::__cxx11::string::~string((string *)&local_a00);
      std::__cxx11::string::~string((string *)&sStack_c08);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a20,"",(allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_a20);
      std::__cxx11::string::~string((string *)&local_a20);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a40,"#[inline]",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_a40);
    std::__cxx11::string::~string((string *)&local_a40);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a60,
               "pub fn finish_{{STRUCT_FN}}_buffer<\'a, \'b, A: flatbuffers::Allocator + \'a>(",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_a60);
    std::__cxx11::string::~string((string *)&local_a60);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a80,"    fbb: &\'b mut flatbuffers::FlatBufferBuilder<\'a, A>,",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_a80);
    std::__cxx11::string::~string((string *)&local_a80);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_aa0,"    root: flatbuffers::WIPOffset<{{STRUCT_TY}}<\'a>>) {",
               (allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_aa0);
    std::__cxx11::string::~string((string *)&local_aa0);
    if ((((this->super_BaseGenerator).parser_)->file_identifier_)._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ae0,"  fbb.finish(root, None);",(allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_ae0);
      psVar3 = &local_ae0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ac0,"  fbb.finish(root, Some({{STRUCT_CONST}}_IDENTIFIER));",
                 (allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_ac0);
      psVar3 = &local_ac0;
    }
    std::__cxx11::string::~string((string *)psVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b00,"}",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_b00);
    std::__cxx11::string::~string((string *)&local_b00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b20,"",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_b20);
    std::__cxx11::string::~string((string *)&local_b20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b40,"#[inline]",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_b40);
    std::__cxx11::string::~string((string *)&local_b40);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b60,
               "pub fn finish_size_prefixed_{{STRUCT_FN}}_buffer<\'a, \'b, A: flatbuffers::Allocator + \'a>(fbb: &\'b mut flatbuffers::FlatBufferBuilder<\'a, A>, root: flatbuffers::WIPOffset<{{STRUCT_TY}}<\'a>>) {"
               ,(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_b60);
    std::__cxx11::string::~string((string *)&local_b60);
    if ((((this->super_BaseGenerator).parser_)->file_identifier_)._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ba0,"  fbb.finish_size_prefixed(root, None);",
                 (allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_ba0);
      psVar3 = &local_ba0;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b80,
                 "  fbb.finish_size_prefixed(root, Some({{STRUCT_CONST}}_IDENTIFIER));",
                 (allocator<char> *)&sStack_c08);
      CodeWriter::operator+=(this_00,&local_b80);
      psVar3 = &local_b80;
    }
    std::__cxx11::string::~string((string *)psVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bc0,"}",(allocator<char> *)&sStack_c08);
    CodeWriter::operator+=(this_00,&local_bc0);
    std::__cxx11::string::~string((string *)&local_bc0);
    return;
  }
  __assert_fail("parser_.root_struct_def_ && \"root table not defined\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                ,0x982,"void flatbuffers::rust::RustGenerator::GenRootTableFuncs(const StructDef &)"
               );
}

Assistant:

void GenRootTableFuncs(const StructDef &struct_def) {
    FLATBUFFERS_ASSERT(parser_.root_struct_def_ && "root table not defined");
    code_.SetValue("STRUCT_TY", namer_.Type(struct_def));
    code_.SetValue("STRUCT_FN", namer_.Function(struct_def));
    code_.SetValue("STRUCT_CONST", namer_.Constant(struct_def.name));

    // Default verifier root fns.
    code_ += "#[inline]";
    code_ += "/// Verifies that a buffer of bytes contains a `{{STRUCT_TY}}`";
    code_ += "/// and returns it.";
    code_ += "/// Note that verification is still experimental and may not";
    code_ += "/// catch every error, or be maximally performant. For the";
    code_ += "/// previous, unchecked, behavior use";
    code_ += "/// `root_as_{{STRUCT_FN}}_unchecked`.";
    code_ +=
        "pub fn root_as_{{STRUCT_FN}}(buf: &[u8]) "
        "-> Result<{{STRUCT_TY}}, flatbuffers::InvalidFlatbuffer> {";
    code_ += "  flatbuffers::root::<{{STRUCT_TY}}>(buf)";
    code_ += "}";
    code_ += "#[inline]";
    code_ += "/// Verifies that a buffer of bytes contains a size prefixed";
    code_ += "/// `{{STRUCT_TY}}` and returns it.";
    code_ += "/// Note that verification is still experimental and may not";
    code_ += "/// catch every error, or be maximally performant. For the";
    code_ += "/// previous, unchecked, behavior use";
    code_ += "/// `size_prefixed_root_as_{{STRUCT_FN}}_unchecked`.";
    code_ +=
        "pub fn size_prefixed_root_as_{{STRUCT_FN}}"
        "(buf: &[u8]) -> Result<{{STRUCT_TY}}, "
        "flatbuffers::InvalidFlatbuffer> {";
    code_ += "  flatbuffers::size_prefixed_root::<{{STRUCT_TY}}>(buf)";
    code_ += "}";
    // Verifier with options root fns.
    code_ += "#[inline]";
    code_ += "/// Verifies, with the given options, that a buffer of bytes";
    code_ += "/// contains a `{{STRUCT_TY}}` and returns it.";
    code_ += "/// Note that verification is still experimental and may not";
    code_ += "/// catch every error, or be maximally performant. For the";
    code_ += "/// previous, unchecked, behavior use";
    code_ += "/// `root_as_{{STRUCT_FN}}_unchecked`.";
    code_ += "pub fn root_as_{{STRUCT_FN}}_with_opts<'b, 'o>(";
    code_ += "  opts: &'o flatbuffers::VerifierOptions,";
    code_ += "  buf: &'b [u8],";
    code_ +=
        ") -> Result<{{STRUCT_TY}}<'b>, flatbuffers::InvalidFlatbuffer>"
        " {";
    code_ += "  flatbuffers::root_with_opts::<{{STRUCT_TY}}<'b>>(opts, buf)";
    code_ += "}";
    code_ += "#[inline]";
    code_ += "/// Verifies, with the given verifier options, that a buffer of";
    code_ += "/// bytes contains a size prefixed `{{STRUCT_TY}}` and returns";
    code_ += "/// it. Note that verification is still experimental and may not";
    code_ += "/// catch every error, or be maximally performant. For the";
    code_ += "/// previous, unchecked, behavior use";
    code_ += "/// `root_as_{{STRUCT_FN}}_unchecked`.";
    code_ +=
        "pub fn size_prefixed_root_as_{{STRUCT_FN}}_with_opts"
        "<'b, 'o>(";
    code_ += "  opts: &'o flatbuffers::VerifierOptions,";
    code_ += "  buf: &'b [u8],";
    code_ +=
        ") -> Result<{{STRUCT_TY}}<'b>, flatbuffers::InvalidFlatbuffer>"
        " {";
    code_ +=
        "  flatbuffers::size_prefixed_root_with_opts::<{{STRUCT_TY}}"
        "<'b>>(opts, buf)";
    code_ += "}";
    // Unchecked root fns.
    code_ += "#[inline]";
    code_ +=
        "/// Assumes, without verification, that a buffer of bytes "
        "contains a {{STRUCT_TY}} and returns it.";
    code_ += "/// # Safety";
    code_ +=
        "/// Callers must trust the given bytes do indeed contain a valid"
        " `{{STRUCT_TY}}`.";
    code_ +=
        "pub unsafe fn root_as_{{STRUCT_FN}}_unchecked"
        "(buf: &[u8]) -> {{STRUCT_TY}} {";
    code_ += "  flatbuffers::root_unchecked::<{{STRUCT_TY}}>(buf)";
    code_ += "}";
    code_ += "#[inline]";
    code_ +=
        "/// Assumes, without verification, that a buffer of bytes "
        "contains a size prefixed {{STRUCT_TY}} and returns it.";
    code_ += "/// # Safety";
    code_ +=
        "/// Callers must trust the given bytes do indeed contain a valid"
        " size prefixed `{{STRUCT_TY}}`.";
    code_ +=
        "pub unsafe fn size_prefixed_root_as_{{STRUCT_FN}}"
        "_unchecked(buf: &[u8]) -> {{STRUCT_TY}} {";
    code_ +=
        "  flatbuffers::size_prefixed_root_unchecked::<{{STRUCT_TY}}>"
        "(buf)";
    code_ += "}";

    if (parser_.file_identifier_.length()) {
      // Declare the identifier
      // (no lifetime needed as constants have static lifetimes by default)
      code_ += "pub const {{STRUCT_CONST}}_IDENTIFIER: &str\\";
      code_ += " = \"" + parser_.file_identifier_ + "\";";
      code_ += "";

      // Check if a buffer has the identifier.
      code_ += "#[inline]";
      code_ += "pub fn {{STRUCT_FN}}_buffer_has_identifier\\";
      code_ += "(buf: &[u8]) -> bool {";
      code_ += "  flatbuffers::buffer_has_identifier(buf, \\";
      code_ += "{{STRUCT_CONST}}_IDENTIFIER, false)";
      code_ += "}";
      code_ += "";
      code_ += "#[inline]";
      code_ += "pub fn {{STRUCT_FN}}_size_prefixed\\";
      code_ += "_buffer_has_identifier(buf: &[u8]) -> bool {";
      code_ += "  flatbuffers::buffer_has_identifier(buf, \\";
      code_ += "{{STRUCT_CONST}}_IDENTIFIER, true)";
      code_ += "}";
      code_ += "";
    }

    if (parser_.file_extension_.length()) {
      // Return the extension
      code_ += "pub const {{STRUCT_CONST}}_EXTENSION: &str = \\";
      code_ += "\"" + parser_.file_extension_ + "\";";
      code_ += "";
    }

    // Finish a buffer with a given root object:
    code_ += "#[inline]";
    code_ +=
        "pub fn finish_{{STRUCT_FN}}_buffer<'a, 'b, A: "
        "flatbuffers::Allocator + 'a>(";
    code_ += "    fbb: &'b mut flatbuffers::FlatBufferBuilder<'a, A>,";
    code_ += "    root: flatbuffers::WIPOffset<{{STRUCT_TY}}<'a>>) {";
    if (parser_.file_identifier_.length()) {
      code_ += "  fbb.finish(root, Some({{STRUCT_CONST}}_IDENTIFIER));";
    } else {
      code_ += "  fbb.finish(root, None);";
    }
    code_ += "}";
    code_ += "";
    code_ += "#[inline]";
    code_ +=
        "pub fn finish_size_prefixed_{{STRUCT_FN}}_buffer"
        "<'a, 'b, A: flatbuffers::Allocator + 'a>("
        "fbb: &'b mut flatbuffers::FlatBufferBuilder<'a, A>, "
        "root: flatbuffers::WIPOffset<{{STRUCT_TY}}<'a>>) {";
    if (parser_.file_identifier_.length()) {
      code_ +=
          "  fbb.finish_size_prefixed(root, "
          "Some({{STRUCT_CONST}}_IDENTIFIER));";
    } else {
      code_ += "  fbb.finish_size_prefixed(root, None);";
    }
    code_ += "}";
  }